

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isubd-cc.cpp
# Opt level: O0

bool loadViewerProgram(void)

{
  FILE *__stream;
  bool bVar1;
  GLenum GVar2;
  djg_program *program_00;
  char *pcVar3;
  char local_428 [8];
  char buf [1024];
  GLuint *program;
  djg_program *djp;
  
  program_00 = djgp_create();
  fprintf(_stdout,"Loading {Viewer-Program}\n");
  fflush(_stdout);
  if ((0 < g_framebuffer.aa) && (g_framebuffer.aa < 5)) {
    djgp_push_string(program_00,"#define MSAA_FACTOR %i\n",
                     (ulong)(uint)(1 << ((byte)g_framebuffer.aa & 0x1f)));
  }
  pcVar3 = strcat2(local_428,g_app.dir.shader,"viewer.glsl");
  djgp_push_file(program_00,pcVar3);
  __stream = _stdout;
  pcVar3 = strcat2(local_428,g_app.dir.shader,"viewer.glsl");
  fprintf(__stream,"loading: %s\n",pcVar3);
  fflush(_stdout);
  bVar1 = djgp_to_gl(program_00,0x1c2,false,true,g_gl.programs);
  if (bVar1) {
    djgp_release(program_00);
    g_gl.uniforms[0] = (*glad_glGetUniformLocation)(g_gl.programs[0],"u_FramebufferSampler");
    g_gl.uniforms[1] = (*glad_glGetUniformLocation)(g_gl.programs[0],"u_Exposure");
    g_gl.uniforms[2] = (*glad_glGetUniformLocation)(g_gl.programs[0],"u_Gamma");
    configureViewerProgram();
    GVar2 = (*glad_glGetError)();
    djp._7_1_ = GVar2 == 0;
  }
  else {
    fprintf(_stdout,"=> Failure <=\n");
    fflush(_stdout);
    djgp_release(program_00);
    djp._7_1_ = false;
  }
  return djp._7_1_;
}

Assistant:

bool loadViewerProgram()
{
    djg_program *djp = djgp_create();
    GLuint *program = &g_gl.programs[PROGRAM_VIEWER];
    char buf[1024];

    LOG("Loading {Viewer-Program}\n");
    if (g_framebuffer.aa >= AA_MSAA2 && g_framebuffer.aa <= AA_MSAA16)
        djgp_push_string(djp, "#define MSAA_FACTOR %i\n", 1 << g_framebuffer.aa);
    djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "viewer.glsl"));
    LOG("loading: %s\n", strcat2(buf, g_app.dir.shader, "viewer.glsl"));
    if (!djgp_to_gl(djp, 450, false, true, program)) {
        LOG("=> Failure <=\n");
        djgp_release(djp);

        return false;
    }
    djgp_release(djp);

    g_gl.uniforms[UNIFORM_VIEWER_FRAMEBUFFER_SAMPLER] =
        glGetUniformLocation(g_gl.programs[PROGRAM_VIEWER], "u_FramebufferSampler");
    g_gl.uniforms[UNIFORM_VIEWER_EXPOSURE] =
        glGetUniformLocation(g_gl.programs[PROGRAM_VIEWER], "u_Exposure");
    g_gl.uniforms[UNIFORM_VIEWER_GAMMA] =
        glGetUniformLocation(g_gl.programs[PROGRAM_VIEWER], "u_Gamma");

    configureViewerProgram();

    return (glGetError() == GL_NO_ERROR);
}